

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O3

Grammar * __thiscall
xercesc_4_0::IGXMLScanner::loadDTDGrammar(IGXMLScanner *this,InputSource *src,bool toCache)

{
  ReaderMgr *this_00;
  short *psVar1;
  XMLValidator *pXVar2;
  XMLDocumentHandler *pXVar3;
  XMLEntityHandler *pXVar4;
  XMLErrorReporter *pXVar5;
  ValidationContext *pVVar6;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar7;
  XMLStringPool *pXVar8;
  int iVar9;
  GrammarType GVar10;
  uint uVar11;
  int iVar12;
  DTDGrammar *pDVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLReader *reader;
  XMLEntityDecl *this_01;
  void *__src;
  XMLCh *__dest;
  DTDElementDecl *this_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  RuntimeException *pRVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  DocTypeHandler *pDVar15;
  size_t __n;
  XMLCh gDTDStr [4];
  DTDScanner dtdScanner;
  XMLCh local_b0 [4];
  DTDScanner local_a8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  iVar9 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])();
  if ((char)iVar9 == '\0') {
    if (((this->super_XMLScanner).fValidatorFromUser == true) &&
       ((this->super_XMLScanner).fValidate == true)) {
      pRVar14 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (pRVar14,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                 ,0xbd4,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(pRVar14,&RuntimeException::typeinfo,XMLException::~XMLException);
    }
    (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
  }
  pDVar13 = (DTDGrammar *)
            GrammarResolver::getGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
  this->fDTDGrammar = pDVar13;
  if (pDVar13 == (DTDGrammar *)0x0) {
    pDVar13 = (DTDGrammar *)
              XMemory::operator_new(0x40,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    DTDGrammar::DTDGrammar(pDVar13,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    this->fDTDGrammar = pDVar13;
    GrammarResolver::putGrammar((this->super_XMLScanner).fGrammarResolver,(Grammar *)pDVar13);
  }
  else {
    (*(pDVar13->super_Grammar).super_XSerializable._vptr_XSerializable[0x14])(pDVar13);
  }
  pDVar13 = this->fDTDGrammar;
  (this->super_XMLScanner).fGrammar = &pDVar13->super_Grammar;
  GVar10 = (*(pDVar13->super_Grammar).super_XSerializable._vptr_XSerializable[5])();
  this->fGrammarType = GVar10;
  pXVar2 = (this->super_XMLScanner).fValidator;
  (*pXVar2->_vptr_XMLValidator[0xb])(pXVar2,(this->super_XMLScanner).fGrammar);
  pXVar3 = (this->super_XMLScanner).fDocHandler;
  if (pXVar3 != (XMLDocumentHandler *)0x0) {
    (*pXVar3->_vptr_XMLDocumentHandler[9])();
  }
  pXVar4 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar4 != (XMLEntityHandler *)0x0) {
    (*pXVar4->_vptr_XMLEntityHandler[4])();
  }
  pXVar5 = (this->super_XMLScanner).fErrorReporter;
  if (pXVar5 != (XMLErrorReporter *)0x0) {
    (*pXVar5->_vptr_XMLErrorReporter[3])();
  }
  (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[4])();
  pVVar6 = (this->super_XMLScanner).fValidationContext;
  (*pVVar6->_vptr_ValidationContext[9])(pVVar6,0);
  (this->super_XMLScanner).fEntityDeclPoolRetrieved = false;
  pNVar7 = this->fDTDElemNonDeclPool;
  if (pNVar7->fIdCounter != 0) {
    RefHashTableOf<xercesc_4_0::DTDElementDecl,_xercesc_4_0::StringHasher>::removeAll
              (&pNVar7->fBucketList);
    pNVar7->fIdCounter = 0;
  }
  if (toCache) {
    pXVar8 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
    iVar9 = (*src->_vptr_InputSource[5])(src);
    uVar11 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[5])
                       (pXVar8,CONCAT44(extraout_var,iVar9));
    pXVar8 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
    iVar9 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[10])(pXVar8,(ulong)uVar11);
    GrammarResolver::orphanGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
    iVar12 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable)._vptr_XSerializable[0x16])
                       ();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar12) + 0x50))
              ((long *)CONCAT44(extraout_var_00,iVar12),iVar9);
    GrammarResolver::putGrammar
              ((this->super_XMLScanner).fGrammarResolver,(this->super_XMLScanner).fGrammar);
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  reader = ReaderMgr::createReader
                     (this_00,src,false,RefFrom_NonLiteral,Type_General,Source_External,
                      (this->super_XMLScanner).fCalculateSrcOfs,
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader != (XMLReader *)0x0) {
    builtin_memcpy(local_b0,L"DTD",8);
    this_01 = (XMLEntityDecl *)XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
    XMLEntityDecl::XMLEntityDecl(this_01,local_b0,(this->super_XMLScanner).fMemoryManager);
    (this_01->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_00408758;
    *(undefined2 *)&this_01[1].super_XSerializable._vptr_XSerializable = 0;
    *(undefined1 *)((long)&this_01[1].super_XSerializable._vptr_XSerializable + 2) = 0;
    iVar9 = (*src->_vptr_InputSource[5])(src);
    __src = (void *)CONCAT44(extraout_var_01,iVar9);
    if (this_01->fSystemId != (XMLCh *)0x0) {
      (*this_01->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (__src == (void *)0x0) {
      __dest = (XMLCh *)0x0;
    }
    else {
      __n = 0;
      do {
        psVar1 = (short *)((long)__src + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar9 = (*this_01->fMemoryManager->_vptr_MemoryManager[3])(this_01->fMemoryManager,__n);
      __dest = (XMLCh *)CONCAT44(extraout_var_02,iVar9);
      memcpy(__dest,__src,__n);
    }
    this_01->fSystemId = __dest;
    this_01->fIsExternal = true;
    reader->fThrowAtEnd = true;
    ReaderMgr::pushReaderAdoptEntity(this_00,reader,this_01,true);
    if ((this->super_XMLScanner).fDocTypeHandler == (DocTypeHandler *)0x0) {
      pDVar15 = (DocTypeHandler *)0x0;
    }
    else {
      this_02 = (DTDElementDecl *)
                XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      DTDElementDecl::DTDElementDecl
                (this_02,local_b0,(this->super_XMLScanner).fEmptyNamespaceId,Any,
                 (this->super_XMLScanner).fGrammarPoolMemoryManager);
      (this_02->super_XMLElementDecl).fCreateReason = AsRootElem;
      (this_02->super_XMLElementDecl).fExternalElement = true;
      pDVar15 = (this->super_XMLScanner).fDocTypeHandler;
      iVar9 = (*src->_vptr_InputSource[4])(src);
      iVar12 = (*src->_vptr_InputSource[5])(src);
      (*pDVar15->_vptr_DocTypeHandler[4])
                (pDVar15,this_02,CONCAT44(extraout_var_03,iVar9),CONCAT44(extraout_var_04,iVar12),0,
                 1);
      (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(this_02);
      pDVar15 = (this->super_XMLScanner).fDocTypeHandler;
    }
    DTDScanner::DTDScanner
              (&local_a8,(DTDGrammar *)(this->super_XMLScanner).fGrammar,pDVar15,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo
              (&local_a8,&this->super_XMLScanner,this_00,&(this->super_XMLScanner).fBufMgr);
    DTDScanner::scanExtSubsetDecl(&local_a8,false,true);
    if ((this->super_XMLScanner).fValidate == true) {
      pXVar2 = (this->super_XMLScanner).fValidator;
      (*pXVar2->_vptr_XMLValidator[4])(pXVar2,0,1);
    }
    if (toCache) {
      GrammarResolver::cacheGrammars((this->super_XMLScanner).fGrammarResolver);
    }
    pDVar13 = this->fDTDGrammar;
    DTDScanner::~DTDScanner(&local_a8);
    return &pDVar13->super_Grammar;
  }
  iVar9 = (*src->_vptr_InputSource[6])(src);
  pRVar14 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if ((char)iVar9 == '\0') {
    iVar9 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (pRVar14,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0xc10,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_06,iVar9),
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  else {
    iVar9 = (*src->_vptr_InputSource[5])();
    RuntimeException::RuntimeException
              (pRVar14,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0xc0e,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var_05,iVar9),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  __cxa_throw(pRVar14,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

Grammar* IGXMLScanner::loadDTDGrammar(const InputSource& src,
                                      const bool toCache)
{
    // Reset the validators
    fDTDValidator->reset();
    if (fValidatorFromUser)
        fValidator->reset();

    if (!fValidator->handlesDTD()) {
        if (fValidatorFromUser && fValidate)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
        else {
            fValidator = fDTDValidator;
        }
    }

    fDTDGrammar = (DTDGrammar*) fGrammarResolver->getGrammar(XMLUni::fgDTDEntityString);

    if (fDTDGrammar) {
        fDTDGrammar->reset();
    }
    else {
        fDTDGrammar = new (fGrammarPoolMemoryManager) DTDGrammar(fGrammarPoolMemoryManager);
        fGrammarResolver->putGrammar(fDTDGrammar);
    }

    fGrammar = fDTDGrammar;
    fGrammarType = fGrammar->getGrammarType();
    fValidator->setGrammar(fGrammar);

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();
    // and clear out the darned undeclared DTD element pool...
    fDTDElemNonDeclPool->removeAll();

    if (toCache) {

        unsigned int sysId = fGrammarResolver->getStringPool()->addOrFind(src.getSystemId());
        const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(sysId);

        fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
        ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
        fGrammarResolver->putGrammar(fGrammar);
    }

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , false
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );
    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    //  In order to make the processing work consistently, we have to
    //  make this look like an external entity. So create an entity
    //  decl and fill it in and push it with the reader, as happens
    //  with an external entity. Put a janitor on it to insure it gets
    //  cleaned up. The reader manager does not adopt them.
    const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
    DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
    declDTD->setSystemId(src.getSystemId());
    declDTD->setIsExternal(true);

    // Mark this one as a throw at end
    newReader->setThrowAtEnd(true);

    // And push it onto the stack, with its pseudo name
    fReaderMgr.pushReaderAdoptEntity(newReader, declDTD);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler) {

        // Create a dummy root
        DTDElementDecl* rootDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            gDTDStr
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
        rootDecl->setExternalElemDeclaration(true);
        Janitor<DTDElementDecl> janSrc(rootDecl);

        fDocTypeHandler->doctypeDecl(*rootDecl, src.getPublicId(), src.getSystemId(), false, true);
    }

    // Create DTDScanner
    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    // Tell it its not in an include section
    dtdScanner.scanExtSubsetDecl(false, true);

    if (fValidate) {
        //  validate the DTD scan so far
        fValidator->preContentValidation(false, true);
    }

    if (toCache)
        fGrammarResolver->cacheGrammars();

    return fDTDGrammar;
}